

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_pcm_deinterleave_u8(void **dst,void *src,ma_uint64 frameCount,ma_uint32 channels)

{
  ma_uint32 channels_local;
  ma_uint64 frameCount_local;
  void *src_local;
  void **dst_local;
  ma_uint32 iChannel;
  ma_uint64 iFrame;
  ma_uint8 *src_u8;
  ma_uint8 **dst_u8;
  
  for (iFrame = 0; iFrame < frameCount; iFrame = iFrame + 1) {
    for (iChannel = 0; iChannel < channels; iChannel = iChannel + 1) {
      *(undefined1 *)((long)dst[iChannel] + iFrame) =
           *(undefined1 *)((long)src + iFrame * channels + (ulong)iChannel);
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_deinterleave_u8(void** dst, const void* src, ma_uint64 frameCount, ma_uint32 channels)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_deinterleave_u8__reference(dst, src, frameCount, channels);
#else
    ma_pcm_deinterleave_u8__optimized(dst, src, frameCount, channels);
#endif
}